

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_2,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_4> *in_RCX;
  VecAccess<float,_4,_3> local_88;
  Matrix<float,_2,_4> local_5c;
  Vector<float,_3> local_3c;
  undefined1 local_30 [8];
  Type in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,2>((ShaderEvalContext *)(in1.m_data + 2),(int)evalCtx);
  }
  else {
    getInputValue<0,2>((MatrixCaseUtils *)(in1.m_data + 2),evalCtx,0);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,4>((ShaderEvalContext *)local_30,(int)evalCtx);
  }
  else {
    getInputValue<0,4>((MatrixCaseUtils *)local_30,evalCtx,1);
  }
  outerProduct<float,4,2>
            (&local_5c,(MatrixCaseUtils *)(in1.m_data + 2),(Vector<float,_2> *)local_30,in_RCX);
  reduceToVec3((MatrixCaseUtils *)&local_3c,&local_5c);
  tcu::Vector<float,_4>::xyz(&local_88,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_88,&local_3c);
  tcu::Matrix<float,_2,_4>::~Matrix(&local_5c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}